

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O2

int cipher_update(void *vgctx,uchar *out,size_t *outl,size_t outsize,uchar *in,size_t inl)

{
  int iVar1;
  int int_outl;
  int local_14;
  
  if (outl == (size_t *)0x0) {
    local_14 = 0;
  }
  else {
    local_14 = (int)*outl;
  }
  iVar1 = EVP_CipherUpdate(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20),out,&local_14,in,(int)inl);
  if (0 < iVar1 && outl != (size_t *)0x0) {
    *outl = (long)local_14;
  }
  return (int)(0 < iVar1);
}

Assistant:

static int cipher_update(void *vgctx,
                         unsigned char *out, size_t *outl, size_t outsize,
                         const unsigned char *in, size_t inl)
{
    GOST_CTX *gctx = vgctx;
    int int_outl = outl != NULL ? *outl : 0;
    int res = EVP_CipherUpdate(gctx->cctx, out, &int_outl, in, (int)inl);

    if (res > 0 && outl != NULL)
        *outl = (size_t)int_outl;
    return res > 0;
}